

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::join<char_const(&)[182]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [182])

{
  undefined1 local_1108 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local) [182];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = this;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1108);
  inner::join_helper<char_const(&)[182]>
            ((StringStream<4096UL,_4096UL> *)local_1108,
             (char (*) [182])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1108);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1108);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}